

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deltatimes.cpp
# Opt level: O2

void extractDeltaTimesForAllNotes
               (MidiFile *midifile,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *histogram,Options *options)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  MidiEventList *pMVar9;
  MidiEvent *pMVar10;
  ostream *poVar11;
  mapped_type *pmVar12;
  int index;
  double dVar13;
  bool local_20b;
  double local_208;
  key_type local_1f8;
  double local_1d8;
  double local_1d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_1c8;
  double local_1c0;
  stringstream key;
  
  local_1c8 = histogram;
  iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
  std::__cxx11::string::string((string *)&key,"all",(allocator *)&local_1f8);
  bVar2 = smf::Options::getBoolean(options,(string *)&key);
  std::__cxx11::string::~string((string *)&key);
  std::__cxx11::string::string((string *)&key,"seconds",(allocator *)&local_1f8);
  bVar3 = smf::Options::getBoolean(options,(string *)&key);
  std::__cxx11::string::~string((string *)&key);
  if (bVar3) {
    local_20b = true;
    bVar5 = false;
    bVar3 = false;
  }
  else {
    std::__cxx11::string::string((string *)&key,"milliseconds",(allocator *)&local_1f8);
    bVar3 = smf::Options::getBoolean(options,(string *)&key);
    std::__cxx11::string::~string((string *)&key);
    if (bVar3) {
      local_20b = true;
      bVar5 = false;
      bVar3 = true;
    }
    else {
      std::__cxx11::string::string((string *)&key,"quarters",(allocator *)&local_1f8);
      bVar5 = smf::Options::getBoolean(options,(string *)&key);
      std::__cxx11::string::~string((string *)&key);
      bVar3 = false;
      local_20b = bVar2;
    }
  }
  std::__cxx11::string::string((string *)&key,"count",(allocator *)&local_1f8);
  bVar4 = smf::Options::getBoolean(options,(string *)&key);
  std::__cxx11::string::~string((string *)&key);
  if (local_20b != false) {
    smf::MidiFile::doTimeAnalysis(midifile);
  }
  local_1c0 = (double)iVar6;
  local_1d8 = local_1c0;
  if (bVar5 == false) {
    local_1d8 = 1.0;
  }
  for (iVar6 = 0; iVar7 = smf::MidiFile::getTrackCount(midifile), iVar6 < iVar7; iVar6 = iVar6 + 1)
  {
    index = 0;
    iVar7 = -1;
    while( true ) {
      pMVar9 = smf::MidiFile::operator[](midifile,iVar6);
      iVar8 = smf::MidiEventList::getEventCount(pMVar9);
      if (iVar8 <= index) break;
      pMVar9 = smf::MidiFile::operator[](midifile,iVar6);
      pMVar10 = smf::MidiEventList::operator[](pMVar9,index);
      bVar5 = smf::MidiMessage::isNote(&pMVar10->super_MidiMessage);
      iVar8 = iVar7;
      if ((bVar5) && (iVar8 = index, -1 < iVar7)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&key);
        if (bVar2) {
          std::__cxx11::stringbuf::str();
          local_1f8._M_string_length = 0;
          *local_1f8._M_dataplus._M_p = '\0';
          std::__cxx11::string::~string((string *)&local_1f8);
          pMVar9 = smf::MidiFile::operator[](midifile,iVar6);
          pMVar10 = smf::MidiEventList::operator[](pMVar9,index);
          iVar1 = pMVar10->tick;
          pMVar9 = smf::MidiFile::operator[](midifile,iVar6);
          pMVar10 = smf::MidiEventList::operator[](pMVar9,iVar7);
          dVar13 = (double)(iVar1 - pMVar10->tick);
          poVar11 = std::ostream::_M_insert<double>(dVar13);
          std::operator<<(poVar11,"\t");
          poVar11 = std::ostream::_M_insert<double>(dVar13 / local_1c0);
          std::operator<<(poVar11,"\t");
          pMVar9 = smf::MidiFile::operator[](midifile,iVar6);
          pMVar10 = smf::MidiEventList::operator[](pMVar9,index);
          local_208 = pMVar10->seconds;
          pMVar9 = smf::MidiFile::operator[](midifile,iVar6);
          pMVar10 = smf::MidiEventList::operator[](pMVar9,iVar7);
          local_208 = local_208 - pMVar10->seconds;
          poVar11 = std::ostream::_M_insert<double>(local_208);
          std::operator<<(poVar11,"\t");
          local_208 = local_208 * 1000.0;
        }
        else {
          if (local_20b == false) {
            pMVar9 = smf::MidiFile::operator[](midifile,iVar6);
            pMVar10 = smf::MidiEventList::operator[](pMVar9,index);
            iVar1 = pMVar10->tick;
            pMVar9 = smf::MidiFile::operator[](midifile,iVar6);
            pMVar10 = smf::MidiEventList::operator[](pMVar9,iVar7);
            iVar7 = pMVar10->tick;
            std::__cxx11::stringbuf::str();
            local_208 = (double)(iVar1 - iVar7) / local_1d8;
          }
          else {
            pMVar9 = smf::MidiFile::operator[](midifile,iVar6);
            pMVar10 = smf::MidiEventList::operator[](pMVar9,index);
            dVar13 = pMVar10->seconds;
            pMVar9 = smf::MidiFile::operator[](midifile,iVar6);
            pMVar10 = smf::MidiEventList::operator[](pMVar9,iVar7);
            local_1d0 = pMVar10->seconds;
            std::__cxx11::stringbuf::str();
            dVar13 = dVar13 - local_1d0;
            local_208 = dVar13 * 1000.0;
            if (!bVar3) {
              local_208 = dVar13;
            }
          }
          local_1f8._M_string_length = 0;
          *local_1f8._M_dataplus._M_p = '\0';
          std::__cxx11::string::~string((string *)&local_1f8);
        }
        std::ostream::_M_insert<double>(local_208);
        if (bVar4) {
          std::__cxx11::stringbuf::str();
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](local_1c8,&local_1f8);
          *pmVar12 = *pmVar12 + 1;
        }
        else {
          std::__cxx11::stringbuf::str();
          poVar11 = std::operator<<((ostream *)&std::cout,(string *)&local_1f8);
          std::endl<char,std::char_traits<char>>(poVar11);
        }
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::stringstream::~stringstream((stringstream *)&key);
      }
      index = index + 1;
      iVar7 = iVar8;
    }
  }
  return;
}

Assistant:

void extractDeltaTimesForAllNotes(MidiFile& midifile, map<string, int>& histogram,
		Options& options) {
	int tpq = midifile.getTicksPerQuarterNote();
	int timeFormat = TIME_TICKS;
	bool realtimeQ  = false;
	bool allQ = options.getBoolean("all");
	int lastindex = -1;
	if (allQ) {
		realtimeQ = true;
	}
	if (options.getBoolean("seconds")) {
		timeFormat = TIME_SECONDS;
		realtimeQ  = true;
	} else if (options.getBoolean("milliseconds")) {
		timeFormat = TIME_MILLISECONDS;
		realtimeQ  = true;
	} else if (options.getBoolean("quarters")) {
		timeFormat = TIME_QUARTERS;
	}
	bool histogramQ = options.getBoolean("count");

	if (realtimeQ) {
		midifile.doTimeAnalysis();
	}

	for (int i=0; i<midifile.getTrackCount(); i++) {
		lastindex = -1;
		for (int j=0; j<midifile[i].getEventCount(); j++) {
			if (!midifile[i][j].isNote()) {
				continue;
			}
			if (lastindex < 0) {
				lastindex = j;
				continue;
			}
			double value;
			stringstream key;
			if (allQ) {
				key.str().clear();
				value = midifile[i][j].tick - midifile[i][lastindex].tick;
				key << value << "\t";         // MIDI ticks
				key << value/tpq << "\t";     // quarter notes
				value = midifile[i][j].seconds - midifile[i][lastindex].seconds;
				key << value << "\t";         // seconds
				key << value * 1000.0;        // milliseconds
			} else if (realtimeQ) {
				value = midifile[i][j].seconds - midifile[i][lastindex].seconds;
				if (timeFormat == TIME_MILLISECONDS) {
					value *= 1000.0;
				}
				key.str().clear();
				key << value;
			} else {
				value = midifile[i][j].tick - midifile[i][lastindex].tick;
				if (timeFormat == TIME_QUARTERS) {
					value /= tpq;
				}
				key.str().clear();
				key << value;
			}
			if (histogramQ) {
				histogram[key.str()]++;
			} else {
				cout << key.str() << endl;
			}
			lastindex = j;
		}
	}
}